

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<const_kj::FsNode,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::cloneFsNode(DiskDirectory *this)

{
  int in_ECX;
  void *in_RDX;
  FsNode *extraout_RDX;
  long in_RSI;
  void *in_R8;
  Own<const_kj::FsNode,_std::nullptr_t> OVar1;
  DiskHandle local_2c;
  Own<kj::(anonymous_namespace)::DiskDirectory,_std::nullptr_t> local_28;
  
  DiskHandle::clone(&local_2c,(__fn *)(in_RSI + 8),in_RDX,in_ECX,in_R8);
  heap<kj::(anonymous_namespace)::DiskDirectory,kj::OwnFd>((kj *)&local_28,&local_2c.fd);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)local_28.disposer;
  *(DiskDirectory **)&this->super_DiskHandle = local_28.ptr;
  local_28.ptr = (DiskDirectory *)0x0;
  Own<kj::(anonymous_namespace)::DiskDirectory,_std::nullptr_t>::~Own(&local_28);
  OwnFd::~OwnFd(&local_2c.fd);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Array<Entry> listEntries() const override { return DiskHandle::listEntries(); }